

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBlobImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DataBlobImpl::DataBlobImpl
          (DataBlobImpl *this,IReferenceCounters *pRefCounters,IMemoryAllocator *Allocator,
          size_t InitialSize,void *pData)

{
  void *__n;
  bool bVar1;
  uchar *__dest;
  STDAllocator<unsigned_char,_Diligent::IMemoryAllocator> local_58;
  value_type_conflict1 local_31;
  void *local_30;
  void *pData_local;
  size_t InitialSize_local;
  IMemoryAllocator *Allocator_local;
  IReferenceCounters *pRefCounters_local;
  DataBlobImpl *this_local;
  
  local_30 = pData;
  pData_local = (void *)InitialSize;
  InitialSize_local = (size_t)Allocator;
  Allocator_local = (IMemoryAllocator *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  ObjectBase<Diligent::IDataBlob>::ObjectBase
            (&this->super_ObjectBase<Diligent::IDataBlob>,pRefCounters);
  __n = pData_local;
  (this->super_ObjectBase<Diligent::IDataBlob>).super_RefCountedObject<Diligent::IDataBlob>.
  super_IDataBlob.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_010e53b0;
  local_31 = '\0';
  STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>::STDAllocator
            (&local_58,(IMemoryAllocator *)InitialSize_local,"Allocator for vector<Uint8>",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/DataBlobImpl.cpp"
             ,0x43);
  std::vector<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>::
  vector(&this->m_DataBuff,(size_type)__n,&local_31,&local_58);
  bVar1 = std::
          vector<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
          ::empty(&this->m_DataBuff);
  if ((!bVar1) && (local_30 != (void *)0x0)) {
    __dest = std::
             vector<unsigned_char,_Diligent::STDAllocator<unsigned_char,_Diligent::IMemoryAllocator>_>
             ::data(&this->m_DataBuff);
    memcpy(__dest,local_30,(size_t)pData_local);
  }
  return;
}

Assistant:

DataBlobImpl::DataBlobImpl(IReferenceCounters* pRefCounters,
                           IMemoryAllocator&   Allocator,
                           size_t              InitialSize,
                           const void*         pData) :
    TBase{pRefCounters},
    m_DataBuff{InitialSize, Uint8{}, STD_ALLOCATOR_RAW_MEM(Uint8, Allocator, "Allocator for vector<Uint8>")}
{
    if (!m_DataBuff.empty() && pData != nullptr)
    {
        std::memcpy(m_DataBuff.data(), pData, InitialSize);
    }
}